

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::convert(XMLAbstractDoubleFloat *this,char *strValue)

{
  int *piVar1;
  NumberFormatException *this_00;
  MemoryManager *memoryManager;
  double dVar2;
  char *local_20;
  char *endptr;
  char *strValue_local;
  XMLAbstractDoubleFloat *this_local;
  
  endptr = strValue;
  strValue_local = (char *)this;
  normalizeDecimalPoint(strValue);
  local_20 = (char *)0x0;
  piVar1 = __errno_location();
  *piVar1 = 0;
  dVar2 = strtod(endptr,&local_20);
  this->fValue = dVar2;
  if (*local_20 == '\0') {
    piVar1 = __errno_location();
    if (*piVar1 == 0x22) {
      this->fDataConverted = true;
      if (0.0 < this->fValue || this->fValue == 0.0) {
        if (0.0 < this->fValue) {
          if (2.2250738585072014e-308 < this->fValue || this->fValue == 2.2250738585072014e-308) {
            this->fType = PosINF;
            this->fDataOverflowed = true;
          }
          else {
            this->fValue = 0.0;
          }
        }
      }
      else if (this->fValue <= -2.2250738585072014e-308) {
        this->fType = NegINF;
        this->fDataOverflowed = true;
      }
      else {
        this->fValue = 0.0;
      }
    }
    return;
  }
  this_00 = (NumberFormatException *)__cxa_allocate_exception(0x30);
  memoryManager = getMemoryManager(this);
  NumberFormatException::NumberFormatException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
             ,0x1ca,XMLNUM_Inv_chars,memoryManager);
  __cxa_throw(this_00,&NumberFormatException::typeinfo,NumberFormatException::~NumberFormatException
             );
}

Assistant:

void
XMLAbstractDoubleFloat::convert(char* const strValue)
{
    normalizeDecimalPoint(strValue);

    char *endptr = 0;
    errno = 0;
    fValue = strtod(strValue, &endptr);

    // check if all chars are valid char.  If they are, endptr will
    // pointer to the null terminator.
    if (*endptr != '\0')
    {
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, getMemoryManager());
    }

    // check if overflow/underflow occurs
    if (errno == ERANGE)
    {
            
        fDataConverted = true;

        if ( fValue < 0 )
        {
            if (fValue > (-1)*DBL_MIN)
            {
                fValue = 0;
            }
            else
            {
                fType = NegINF;
                fDataOverflowed = true;
            }
        }
        else if ( fValue > 0)
        {
            if (fValue < DBL_MIN )
            {
                fValue = 0;
            }
            else
            {
                fType = PosINF;
                fDataOverflowed = true;
            }
        }
    }
}